

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_>::Data
          (Data<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_> *this,
          Data<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_> *other,size_t reserved)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  QStandardItem *pQVar3;
  Node<QStandardItem_*,_QHashDummyValue> *pNVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t numBuckets;
  R RVar9;
  Bucket BVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar9 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar9.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pSVar2 = other->spans;
      lVar8 = 0;
      do {
        uVar5 = (ulong)pSVar2->offsets[lVar8 + lVar6];
        if (uVar5 != 0xff) {
          key = pSVar2[uVar7].entries + uVar5;
          pQVar3 = *(QStandardItem **)(key->storage).data;
          uVar5 = ((ulong)pQVar3 >> 0x20 ^ (ulong)pQVar3) * -0x2917014799a6026d;
          uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          BVar10 = Data<QHashPrivate::Node<QStandardItem*,QHashDummyValue>>::
                   findBucketWithHash<QStandardItem*>
                             ((Data<QHashPrivate::Node<QStandardItem*,QHashDummyValue>> *)this,
                              (QStandardItem **)key,uVar5 >> 0x20 ^ this->seed ^ uVar5);
          pNVar4 = Span<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_>::insert
                             (BVar10.span,BVar10.index);
          pNVar4->key = *(QStandardItem **)(key->storage).data;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar7 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }